

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema_compile_node.c
# Opt level: O2

LY_ERR lys_compile_node_any(lysc_ctx *ctx,lysp_node *pnode,lysc_node *node)

{
  lysp_node *plVar1;
  LY_ERR LVar2;
  long *plVar3;
  lysp_ext_instance *plVar4;
  lysp_ext_instance *plVar5;
  char *pcVar6;
  long lVar7;
  lysp_restr *must_p;
  long lVar8;
  long lVar9;
  
  plVar1 = pnode[1].parent;
  if (plVar1 != (lysp_node *)0x0) {
    lVar7 = *(long *)(node + 1);
    if (lVar7 == 0) {
      plVar3 = (long *)calloc(1,(long)plVar1[-1].exts * 0x38 + 8);
      if (plVar3 == (long *)0x0) goto LAB_00149067;
      lVar7 = 0;
      lVar8 = 0;
    }
    else {
      lVar8 = *(long *)(lVar7 + -8);
      plVar3 = (long *)realloc((void *)(lVar7 + -8),
                               ((long)&(plVar1[-1].exts)->name + lVar8 * 2) * 0x38 + 8);
      if (plVar3 == (long *)0x0) {
LAB_00149067:
        ly_log(ctx->ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","lys_compile_node_any");
        return LY_EMEM;
      }
      lVar7 = *plVar3;
    }
    *(long **)(node + 1) = plVar3 + 1;
    if (pnode[1].parent == (lysp_node *)0x0) {
      plVar4 = (lysp_ext_instance *)0x0;
    }
    else {
      plVar4 = pnode[1].parent[-1].exts;
    }
    lVar9 = 0;
    memset(plVar3 + lVar7 * 7 + 1,0,((long)&plVar4->name + lVar8) * 0x38);
    plVar4 = (lysp_ext_instance *)0xffffffffffffffff;
    while( true ) {
      plVar1 = pnode[1].parent;
      if (plVar1 == (lysp_node *)0x0) {
        plVar5 = (lysp_ext_instance *)0x0;
      }
      else {
        plVar5 = plVar1[-1].exts;
      }
      plVar4 = (lysp_ext_instance *)((long)&plVar4->name + 1);
      if (plVar5 <= plVar4) break;
      lVar7 = *(long *)(node + 1);
      lVar8 = *(long *)(lVar7 + -8);
      *(long *)(lVar7 + -8) = lVar8 + 1;
      must_p = (lysp_restr *)((long)&plVar1->parent + lVar9);
      lVar9 = lVar9 + 0x40;
      LVar2 = lys_compile_must(ctx,must_p,(lysc_must *)(lVar8 * 0x38 + lVar7));
      if (LVar2 != LY_SUCCESS) {
        return LVar2;
      }
    }
  }
  LVar2 = lysc_unres_must_add(ctx,node,pnode);
  if (LVar2 != LY_SUCCESS) {
    return LVar2;
  }
  if ((node->flags & 1) == 0) {
    return LY_SUCCESS;
  }
  pcVar6 = lyplg_ext_stmt2str((uint)(node->nodetype != 0x60) * 0x20 + LY_STMT_ANYDATA);
  ly_log((ly_ctx *)0x0,LY_LLVRB,LY_SUCCESS,
         "Use of %s to define configuration data is not recommended. %s",pcVar6,ctx->path);
  return LY_SUCCESS;
}

Assistant:

static LY_ERR
lys_compile_node_any(struct lysc_ctx *ctx, struct lysp_node *pnode, struct lysc_node *node)
{
    struct lysp_node_anydata *any_p = (struct lysp_node_anydata *)pnode;
    struct lysc_node_anydata *any = (struct lysc_node_anydata *)node;
    LY_ERR ret = LY_SUCCESS;

    COMPILE_ARRAY_GOTO(ctx, any_p->musts, any->musts, lys_compile_must, ret, done);

    /* add must(s) to unres */
    ret = lysc_unres_must_add(ctx, node, pnode);
    LY_CHECK_GOTO(ret, done);

    if (any->flags & LYS_CONFIG_W) {
        LOGVRB("Use of %s to define configuration data is not recommended. %s",
                lyplg_ext_stmt2str(any->nodetype == LYS_ANYDATA ? LY_STMT_ANYDATA : LY_STMT_ANYXML), ctx->path);
    }
done:
    return ret;
}